

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte_node.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::CTENode::Copy(CTENode *this)

{
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  pointer pCVar3;
  pointer pQVar4;
  type other;
  QueryNode *in_RSI;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_28;
  __uniq_ptr_data<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true,_true> local_20;
  
  make_uniq<duckdb::CTENode>();
  pCVar3 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                     ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *)
                      &local_20);
  ::std::__cxx11::string::_M_assign((string *)&pCVar3->ctename);
  pQVar4 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *
                      )&in_RSI[1].modifiers.
                        super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (*pQVar4->_vptr_QueryNode[5])(&local_28,pQVar4);
  pCVar3 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                     ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *)
                      &local_20);
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (QueryNode *)0x0;
  _Var1._M_head_impl =
       (pCVar3->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pCVar3->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QueryNode + 8))();
    if (local_28._M_head_impl != (QueryNode *)0x0) {
      (*(local_28._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  pQVar4 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *
                      )&in_RSI[1].cte_map);
  (*pQVar4->_vptr_QueryNode[5])(&local_28,pQVar4);
  pCVar3 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                     ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *)
                      &local_20);
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (QueryNode *)0x0;
  _Var1._M_head_impl =
       (pCVar3->child).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pCVar3->child).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QueryNode + 8))();
    if (local_28._M_head_impl != (QueryNode *)0x0) {
      (*(local_28._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  pCVar3 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                     ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *)
                      &local_20);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pCVar3->aliases,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&in_RSI[1].cte_map.map.map.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  other = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator*
                    ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *)
                     &local_20);
  QueryNode::CopyProperties(in_RSI,&other->super_QueryNode);
  (this->super_QueryNode)._vptr_QueryNode =
       (_func_int **)
       local_20.super___uniq_ptr_impl<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CTENode_*,_std::default_delete<duckdb::CTENode>_>.
       super__Head_base<0UL,_duckdb::CTENode_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> CTENode::Copy() const {
	auto result = make_uniq<CTENode>();
	result->ctename = ctename;
	result->query = query->Copy();
	result->child = child->Copy();
	result->aliases = aliases;
	this->CopyProperties(*result);
	return std::move(result);
}